

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_parse.cpp
# Opt level: O3

void __thiscall FParser::EvaluateExpression(FParser *this,svalue_t *result,int start,int stop)

{
  char *value;
  int stop_00;
  int start_00;
  int iVar1;
  FString *this_00;
  undefined8 extraout_RAX;
  code *UNRECOVERED_JUMPTABLE;
  long lVar2;
  long lVar3;
  long *plVar4;
  FString tempstr;
  FString local_40;
  int local_38;
  int local_34;
  
  local_38 = stop;
  local_34 = start;
  if ((this->TokenType[start] == operator_) && (this->TokenType[stop] == operator_)) {
    PointlessBrackets(this,&local_34,&local_38);
  }
  start_00 = local_34;
  stop_00 = local_38;
  if (local_34 == local_38) {
    SimpleEvaluate(this,result,local_38);
    return;
  }
  lVar2 = (long)num_operators;
  if (0 < lVar2) {
    lVar3 = 0;
    do {
      value = *(char **)((long)&operators[0].string + lVar3);
      if (*(int *)((long)&operators[0].direction + lVar3) == 0) {
        iVar1 = FindOperatorBackwards(this,start_00,stop_00,value);
      }
      else {
        iVar1 = FindOperator(this,start_00,stop_00,value);
      }
      if (iVar1 != -1) {
        UNRECOVERED_JUMPTABLE = *(code **)((long)&operators[0].handler + lVar3);
        plVar4 = (long *)((long)this->Tokens + *(long *)(&operators[0].field_0x10 + lVar3) + -0x10);
        if (((ulong)UNRECOVERED_JUMPTABLE & 1) != 0) {
          UNRECOVERED_JUMPTABLE = *(code **)(UNRECOVERED_JUMPTABLE + *plVar4 + -1);
        }
        (*UNRECOVERED_JUMPTABLE)(plVar4,result,start_00,iVar1,stop_00,UNRECOVERED_JUMPTABLE);
        return;
      }
      lVar3 = lVar3 + 0x20;
    } while (lVar2 * 0x20 != lVar3);
  }
  if (this->TokenType[start_00] != function) {
    local_40.Chars = FString::NullString.Nothing;
    FString::NullString.RefCount = FString::NullString.RefCount + 1;
    if (start_00 <= stop_00) {
      lVar2 = 0;
      do {
        this_00 = FString::operator+=(&local_40,this->Tokens[start_00 + lVar2]);
        FString::operator+=(this_00,' ');
        lVar2 = lVar2 + 1;
      } while ((stop_00 - start_00) + 1 != (int)lVar2);
    }
    script_error("couldnt evaluate expression: %s\n",local_40.Chars);
    FString::~FString(&local_40);
    _Unwind_Resume(extraout_RAX);
  }
  EvaluateFunction(this,result,start_00,stop_00);
  return;
}

Assistant:

void FParser::EvaluateExpression(svalue_t &result, int start, int stop)
{
	int i, n;
	
	// possible pointless brackets
	if(TokenType[start] == operator_ && TokenType[stop] == operator_)
		PointlessBrackets(&start, &stop);

	if(start == stop)       // only 1 thing to evaluate
    {
		SimpleEvaluate(result, start);
		return;
    }
	
	// go through each operator in order of precedence
	for(i=0; i<num_operators; i++)
    {
		// check backwards for the token. it has to be
		// done backwards for left-to-right reading: eg so
		// 5-3-2 is (5-3)-2 not 5-(3-2)
		
		if (operators[i].direction==forward)
		{
			n = FindOperatorBackwards(start, stop, operators[i].string);
		}
		else
		{
			n = FindOperator(start, stop, operators[i].string);
		}

		if( n != -1)
		{
			// call the operator function and evaluate this chunk of tokens
			(this->*operators[i].handler)(result, start, n, stop);
			return;
		}
    }
	
	if(TokenType[start] == function)
	{
		EvaluateFunction(result, start, stop);
		return;
	}
	
	// error ?
	{        
		FString tempstr;
		
		for(i=start; i<=stop; i++) tempstr << Tokens[i] << ' ';
		script_error("couldnt evaluate expression: %s\n",tempstr.GetChars());
	}
}